

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Colour::Valid(Colour *this)

{
  bool bVar1;
  Colour *this_local;
  
  if ((this->mastering_metadata_ != (MasteringMetadata *)0x0) &&
     (bVar1 = MasteringMetadata::Valid(this->mastering_metadata_), !bVar1)) {
    return false;
  }
  if ((this->matrix_coefficients_ != 0xffffffffffffffff) &&
     (bVar1 = IsMatrixCoefficientsValueValid(this->matrix_coefficients_), !bVar1)) {
    return false;
  }
  if ((this->chroma_siting_horz_ != 0xffffffffffffffff) &&
     (bVar1 = IsChromaSitingHorzValueValid(this->chroma_siting_horz_), !bVar1)) {
    return false;
  }
  if ((this->chroma_siting_vert_ != 0xffffffffffffffff) &&
     (bVar1 = IsChromaSitingVertValueValid(this->chroma_siting_vert_), !bVar1)) {
    return false;
  }
  if ((this->range_ != 0xffffffffffffffff) &&
     (bVar1 = IsColourRangeValueValid(this->range_), !bVar1)) {
    return false;
  }
  if ((this->transfer_characteristics_ != 0xffffffffffffffff) &&
     (bVar1 = IsTransferCharacteristicsValueValid(this->transfer_characteristics_), !bVar1)) {
    return false;
  }
  if ((this->primaries_ != 0xffffffffffffffff) &&
     (bVar1 = IsPrimariesValueValid(this->primaries_), !bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool Colour::Valid() const {
  if (mastering_metadata_ && !mastering_metadata_->Valid())
    return false;
  if (matrix_coefficients_ != kValueNotPresent &&
      !IsMatrixCoefficientsValueValid(matrix_coefficients_)) {
    return false;
  }
  if (chroma_siting_horz_ != kValueNotPresent &&
      !IsChromaSitingHorzValueValid(chroma_siting_horz_)) {
    return false;
  }
  if (chroma_siting_vert_ != kValueNotPresent &&
      !IsChromaSitingVertValueValid(chroma_siting_vert_)) {
    return false;
  }
  if (range_ != kValueNotPresent && !IsColourRangeValueValid(range_))
    return false;
  if (transfer_characteristics_ != kValueNotPresent &&
      !IsTransferCharacteristicsValueValid(transfer_characteristics_)) {
    return false;
  }
  if (primaries_ != kValueNotPresent && !IsPrimariesValueValid(primaries_))
    return false;

  return true;
}